

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::python::Generator::PrintImports(Generator *this)

{
  size_type *psVar1;
  string *filename;
  int iVar2;
  FileDescriptor *pFVar3;
  char **ppcVar4;
  ulong uVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  int index;
  long lVar11;
  bool bVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  string module_name;
  string module_alias;
  undefined1 local_138 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  Generator *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pFVar3 = this->file_;
  if (0 < *(int *)(pFVar3 + 0x18)) {
    index = 0;
    local_f8 = this;
    do {
      pFVar3 = FileDescriptor::dependency(pFVar3,index);
      filename = *(string **)pFVar3;
      anon_unknown_0::ModuleName((string *)&local_118,filename);
      anon_unknown_0::ModuleAlias(&local_70,filename);
      local_138._0_8_ = (pointer)0x0;
      local_138._8_8_ = (pointer)0x0;
      local_138._16_8_ = (pointer)0x0;
      SplitStringUsing((string *)&local_118,".",
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_138);
      bVar12 = local_138._8_8_ != local_138._0_8_;
      if (bVar12) {
        lVar11 = 0;
        uVar10 = 0;
        do {
          ppcVar4 = std::
                    __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((anonymous_namespace)::kKeywords,&ruby::Generator::vtable,
                               (pointer)(local_138._0_8_ + lVar11));
          if (ppcVar4 != (char **)&ruby::Generator::vtable) break;
          uVar10 = uVar10 + 1;
          uVar5 = (long)(local_138._8_8_ - local_138._0_8_) >> 5;
          lVar11 = lVar11 + 0x20;
          bVar12 = uVar10 < uVar5;
        } while (uVar10 < uVar5);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
      this = local_f8;
      if (bVar12) {
        io::Printer::Print(local_f8->printer_,"import importlib\n");
        io::Printer::Print(this->printer_,"$alias$ = importlib.import_module(\'$name$\')\n","alias",
                           &local_70,"name",(string *)&local_118);
      }
      else {
        iVar2 = std::__cxx11::string::rfind((char)&local_118,0x2e);
        local_138._0_8_ = local_138 + 0x10;
        local_138._8_8_ = (pointer)0x0;
        local_138._16_8_ = local_138._16_8_ & 0xffffffffffffff00;
        if (iVar2 == -1) {
          std::operator+(&local_f0,"import ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_118);
          std::__cxx11::string::operator=((string *)local_138,(string *)&local_f0);
          this = local_f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            this = local_f8;
          }
        }
        else {
          std::__cxx11::string::substr((ulong)local_50,(ulong)&local_118);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3b2e02);
          local_90 = &local_80;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_80 = *plVar8;
            lStack_78 = plVar6[3];
          }
          else {
            local_80 = *plVar8;
            local_90 = (long *)*plVar6;
          }
          local_88 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
          puVar9 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar9) {
            local_c0 = *puVar9;
            lStack_b8 = plVar6[3];
            local_d0 = &local_c0;
          }
          else {
            local_c0 = *puVar9;
            local_d0 = (ulong *)*plVar6;
          }
          local_c8 = plVar6[1];
          *plVar6 = (long)puVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_118);
          this = local_f8;
          uVar10 = 0xf;
          if (local_d0 != &local_c0) {
            uVar10 = local_c0;
          }
          if (uVar10 < (ulong)(local_a8 + local_c8)) {
            uVar10 = 0xf;
            if (local_b0 != local_a0) {
              uVar10 = local_a0[0];
            }
            if (uVar10 < (ulong)(local_a8 + local_c8)) goto LAB_00240ebb;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
          }
          else {
LAB_00240ebb:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
          }
          psVar1 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_f0.field_2._M_allocated_capacity = *psVar1;
            local_f0.field_2._8_8_ = puVar7[3];
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar1;
            local_f0._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_f0._M_string_length = puVar7[1];
          *puVar7 = psVar1;
          puVar7[1] = 0;
          *(undefined1 *)psVar1 = 0;
          std::__cxx11::string::operator=((string *)local_138,(string *)&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,local_c0 + 1);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
        io::Printer::Print(this->printer_,"$statement$ as $alias$\n","statement",(string *)local_138
                           ,"alias",&local_70);
        if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
        }
      }
      pFVar3 = FileDescriptor::dependency(this->file_,index);
      CopyPublicDependenciesAliases(this,&local_70,pFVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1)
        ;
      }
      index = index + 1;
      pFVar3 = this->file_;
    } while (index < *(int *)(pFVar3 + 0x18));
  }
  io::Printer::Print(this->printer_,"\n");
  pFVar3 = this->file_;
  if (0 < *(int *)(pFVar3 + 0x38)) {
    lVar11 = 0;
    do {
      pFVar3 = FileDescriptor::dependency(pFVar3,*(int *)(*(long *)(pFVar3 + 0x40) + lVar11 * 4));
      anon_unknown_0::ModuleName((string *)&local_118,*(string **)pFVar3);
      io::Printer::Print(this->printer_,"from $module$ import *\n","module",(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1)
        ;
      }
      lVar11 = lVar11 + 1;
      pFVar3 = this->file_;
    } while (lVar11 < *(int *)(pFVar3 + 0x38));
  }
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintImports() const {
  for (int i = 0; i < file_->dependency_count(); ++i) {
    const string& filename = file_->dependency(i)->name();

    string module_name = ModuleName(filename);
    string module_alias = ModuleAlias(filename);
    if (ContainsPythonKeyword(module_name)) {
      // If the module path contains a Python keyword, we have to quote the
      // module name and import it using importlib. Otherwise the usual kind of
      // import statement would result in a syntax error from the presence of
      // the keyword.
      printer_->Print("import importlib\n");
      printer_->Print("$alias$ = importlib.import_module('$name$')\n", "alias",
                      module_alias, "name", module_name);
    } else {
      int last_dot_pos = module_name.rfind('.');
      string import_statement;
      if (last_dot_pos == string::npos) {
        // NOTE(petya): this is not tested as it would require a protocol buffer
        // outside of any package, and I don't think that is easily achievable.
        import_statement = "import " + module_name;
      } else {
        import_statement = "from " + module_name.substr(0, last_dot_pos) +
                           " import " + module_name.substr(last_dot_pos + 1);
      }
      printer_->Print("$statement$ as $alias$\n", "statement", import_statement,
                      "alias", module_alias);
    }

    CopyPublicDependenciesAliases(module_alias, file_->dependency(i));
  }
  printer_->Print("\n");

  // Print public imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    string module_name = ModuleName(file_->public_dependency(i)->name());
    printer_->Print("from $module$ import *\n", "module", module_name);
  }
  printer_->Print("\n");
}